

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O2

void BackwardReferences2DLocality(int xsize,VP8LBackwardRefs *refs)

{
  PixOrCopy *pPVar1;
  uint32_t uVar2;
  VP8LRefsCursor c;
  VP8LRefsCursor local_30;
  
  local_30.cur_block_ = refs->refs_;
  if (local_30.cur_block_ == (PixOrCopyBlock *)0x0) {
    local_30.cur_pos = (PixOrCopy *)0x0;
    local_30.last_pos_ = (PixOrCopy *)0x0;
  }
  else {
    local_30.cur_pos = (local_30.cur_block_)->start_;
    local_30.last_pos_ = local_30.cur_pos + (local_30.cur_block_)->size_;
  }
  while (pPVar1 = local_30.cur_pos, local_30.cur_pos != (PixOrCopy *)0x0) {
    if ((local_30.cur_pos)->mode == '\x02') {
      uVar2 = VP8LDistanceToPlaneCode(xsize,(local_30.cur_pos)->argb_or_distance);
      pPVar1->argb_or_distance = uVar2;
    }
    VP8LRefsCursorNext(&local_30);
  }
  return;
}

Assistant:

static void BackwardReferences2DLocality(int xsize,
                                         const VP8LBackwardRefs* const refs) {
  VP8LRefsCursor c = VP8LRefsCursorInit(refs);
  while (VP8LRefsCursorOk(&c)) {
    if (PixOrCopyIsCopy(c.cur_pos)) {
      const int dist = c.cur_pos->argb_or_distance;
      const int transformed_dist = VP8LDistanceToPlaneCode(xsize, dist);
      c.cur_pos->argb_or_distance = transformed_dist;
    }
    VP8LRefsCursorNext(&c);
  }
}